

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPSDESInfo::SetPrivateValue
          (RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen,uint8_t *value,size_t valuelen)

{
  list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  *this_00;
  int iVar1;
  SDESPrivateItem *this_01;
  _List_node_base *p_Var2;
  SDESPrivateItem *item;
  size_t local_38;
  
  this_00 = &this->privitems;
  p_Var2 = (_List_node_base *)this_00;
  local_38 = valuelen;
  do {
    p_Var2 = (((_List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this_00) {
      if (0xff < (this->privitems).
                 super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
                 ._M_impl._M_node._M_size) {
        return -0x38;
      }
      this_01 = (SDESPrivateItem *)operator_new(0x30,(this->super_RTPMemoryObject).mgr,0x1e);
      (this_01->super_SDESItem).super_RTPMemoryObject.mgr = (this->super_RTPMemoryObject).mgr;
      (this_01->super_SDESItem).str = (uint8_t *)0x0;
      (this_01->super_SDESItem).length = 0;
      (this_01->super_SDESItem).super_RTPMemoryObject._vptr_RTPMemoryObject =
           (_func_int **)&PTR__SDESPrivateItem_00145a50;
      this_01->prefix = (uint8_t *)0x0;
      this_01->prefixlen = 0;
      item = this_01;
      iVar1 = SDESPrivateItem::SetPrefix(this_01,prefix,prefixlen);
      if (iVar1 < 0) {
        RTPDelete<jrtplib::RTCPSDESInfo::SDESPrivateItem>(this_01,(this->super_RTPMemoryObject).mgr)
        ;
        return iVar1;
      }
      std::__cxx11::
      list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
      ::push_front(this_00,&item);
      goto LAB_001311c3;
    }
  } while ((*(size_t *)((long)p_Var2[1]._M_next + 0x28) != prefixlen) ||
          ((prefixlen != 0 &&
           (iVar1 = bcmp(prefix,*(void **)((long)p_Var2[1]._M_next + 0x20),prefixlen), iVar1 != 0)))
          );
  item = (SDESPrivateItem *)p_Var2[1]._M_next;
LAB_001311c3:
  iVar1 = SDESItem::SetInfo(&item->super_SDESItem,value,local_38);
  return iVar1;
}

Assistant:

int RTCPSDESInfo::SetPrivateValue(const uint8_t *prefix,size_t prefixlen,const uint8_t *value,size_t valuelen)
{
	std::list<SDESPrivateItem *>::const_iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	
	SDESPrivateItem *item;
	
	if (found) // replace the value for this entry
		item = *it;
	else // no entry for this prefix found... add it
	{
		if (privitems.size() >= RTP_MAXPRIVITEMS) // too many items present, just ignore it
			return ERR_RTP_SDES_MAXPRIVITEMS;
		
		int status;
		
		item = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_SDESPRIVATEITEM) SDESPrivateItem(GetMemoryManager());
		if (item == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = item->SetPrefix(prefix,prefixlen)) < 0)
		{
			RTPDelete(item,GetMemoryManager());
			return status;
		}
		privitems.push_front(item);
	}
	return item->SetInfo(value,valuelen);
}